

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O0

void ClownLZSS::Internal::Gba::EncodeMatches<std::ofstream>
               (uchar *data,Matches *matches,size_t total_matches,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  __mbstate_t this;
  uint value;
  type __i;
  type __s;
  ClownLZSS_Match *pCVar1;
  ClownLZSS_Match *match;
  ClownLZSS_Match *__end3;
  ClownLZSS_Match *__begin3;
  subrange<ClownLZSS_Match_*,_ClownLZSS_Match_*,_(std::ranges::subrange_kind)1> local_68;
  subrange<ClownLZSS_Match_*,_ClownLZSS_Match_*,_(std::ranges::subrange_kind)1> *local_58;
  subrange<ClownLZSS_Match_*,_ClownLZSS_Match_*,_(std::ranges::subrange_kind)1> *__range3;
  DescriptorFieldWriter<decltype(output)> descriptor_bits;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output_local;
  size_t total_matches_local;
  Matches *matches_local;
  uchar *data_local;
  
  descriptor_bits.descriptor_position._M_state = (__mbstate_t)output;
  BitField::
  DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
  ::DescriptorFieldWriter
            ((DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
              *)&__range3,output);
  __i = std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::operator[](matches,0)
  ;
  __s = std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::operator[]
                  (matches,total_matches);
  std::ranges::subrange<ClownLZSS_Match_*,_ClownLZSS_Match_*,_(std::ranges::subrange_kind)1>::
  subrange<ClownLZSS_Match_*>(&local_68,__i,__s);
  local_58 = &local_68;
  __end3 = std::ranges::
           subrange<ClownLZSS_Match_*,_ClownLZSS_Match_*,_(std::ranges::subrange_kind)1>::begin
                     (local_58);
  pCVar1 = std::ranges::
           subrange<ClownLZSS_Match_*,_ClownLZSS_Match_*,_(std::ranges::subrange_kind)1>::end
                     (local_58);
  for (; __end3 != pCVar1; __end3 = __end3 + 1) {
    if (__end3->source == __end3->destination + 1) {
      BitField::
      WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
      ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              *)&__range3,false);
      OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
               *)descriptor_bits.descriptor_position._M_state,data[__end3->destination]);
    }
    else {
      BitField::
      WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
      ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              *)&__range3,true);
      this = descriptor_bits.descriptor_position._M_state;
      value = EncodeMatch(__end3);
      OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
      ::WriteLE16((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *)this,value);
    }
  }
  BitField::
  DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
  ::~DescriptorFieldWriter
            ((DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
              *)&__range3);
  return;
}

Assistant:

void EncodeMatches(const unsigned char* const data, const Matches& matches, std::size_t total_matches, CompressorOutput<T> &output)
			{
				DescriptorFieldWriter<decltype(output)> descriptor_bits(output);
				for (const auto& match : std::ranges::subrange(&matches[0], &matches[total_matches]))
				{
					if (CLOWNLZSS_MATCH_IS_LITERAL(&match))
					{
						descriptor_bits.Push(0);
						output.Write(data[match.destination]);
					}
					else
					{
						descriptor_bits.Push(1);
						output.WriteLE16(EncodeMatch(match));
					}
				}
			}